

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool TaprootBuilder::ValidDepths(vector<int,_std::allocator<int>_> *depths)

{
  long lVar1;
  bool bVar2;
  uint *puVar3;
  size_type sVar4;
  long in_FS_OFFSET;
  reference rVar5;
  int depth;
  vector<int,_std::allocator<int>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<bool,_std::allocator<bool>_> branch;
  _Bit_reference *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  _Bit_reference *in_stack_fffffffffffffef8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff00;
  bool local_f2;
  bool local_f1;
  _Bit_type *in_stack_ffffffffffffff38;
  bool local_b9;
  uint local_9c;
  bool local_81;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffee8);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  do {
    bVar2 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffef8,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      sVar4 = ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef8);
      local_f1 = true;
      if (sVar4 != 0) {
        sVar4 = ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef8);
        local_f2 = false;
        if (sVar4 == 1) {
          std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef8,
                     CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
          local_f2 = std::_Bit_reference::operator_cast_to_bool(in_stack_fffffffffffffee8);
        }
        local_f1 = local_f2;
      }
      local_81 = local_f1;
LAB_007e6e91:
      ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffee8);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_81;
    }
    puVar3 = (uint *)__gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)in_stack_fffffffffffffee8);
    local_9c = *puVar3;
    if (((int)local_9c < 0) || (0x80 < local_9c)) {
      local_81 = false;
      goto LAB_007e6e91;
    }
    sVar4 = ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef8);
    if ((long)(int)local_9c + 1U < sVar4) {
      local_81 = false;
      goto LAB_007e6e91;
    }
    while( true ) {
      sVar4 = ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef8);
      local_b9 = false;
      if ((ulong)(long)(int)local_9c < sVar4) {
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef8,
                           CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
        in_stack_ffffffffffffff38 = rVar5._M_p;
        local_b9 = std::_Bit_reference::operator_cast_to_bool(in_stack_fffffffffffffee8);
      }
      if (local_b9 == false) break;
      std::vector<bool,_std::allocator<bool>_>::pop_back
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffee8);
      if (local_9c == 0) {
        local_81 = false;
        goto LAB_007e6e91;
      }
      local_9c = local_9c - 1;
    }
    sVar4 = ::wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef8);
    if (sVar4 <= (ulong)(long)(int)local_9c) {
      std::vector<bool,_std::allocator<bool>_>::resize
                (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8,
                 SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
    }
    std::vector<bool,_std::allocator<bool>_>::operator[]
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef8,
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    bVar2 = std::_Bit_reference::operator_cast_to_bool(in_stack_fffffffffffffee8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!branch[depth]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                    ,0x167,"static bool TaprootBuilder::ValidDepths(const std::vector<int> &)");
    }
    std::vector<bool,_std::allocator<bool>_>::operator[]
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef8,
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    ::wallet::_GLOBAL__N_1::std::_Bit_reference::operator=
              (in_stack_fffffffffffffef8,(bool)in_stack_fffffffffffffef7);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffee8);
  } while( true );
}

Assistant:

bool TaprootBuilder::ValidDepths(const std::vector<int>& depths)
{
    std::vector<bool> branch;
    for (int depth : depths) {
        // This inner loop corresponds to effectively the same logic on branch
        // as what Insert() performs on the m_branch variable. Instead of
        // storing a NodeInfo object, just remember whether or not there is one
        // at that depth.
        if (depth < 0 || (size_t)depth > TAPROOT_CONTROL_MAX_NODE_COUNT) return false;
        if ((size_t)depth + 1 < branch.size()) return false;
        while (branch.size() > (size_t)depth && branch[depth]) {
            branch.pop_back();
            if (depth == 0) return false;
            --depth;
        }
        if (branch.size() <= (size_t)depth) branch.resize((size_t)depth + 1);
        assert(!branch[depth]);
        branch[depth] = true;
    }
    // And this check corresponds to the IsComplete() check on m_branch.
    return branch.size() == 0 || (branch.size() == 1 && branch[0]);
}